

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::EndTable(void)

{
  ImVec2 *pIVar1;
  ImVec4 *pIVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiTable *pIVar7;
  ImGuiWindow *window;
  ImGuiWindow *pIVar8;
  ImGuiTableTempData *pIVar9;
  ImDrawListSplitter *this;
  ImGuiTableColumn *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  int iVar13;
  ImGuiTableInstanceData *pIVar14;
  long lVar15;
  ImGuiTableTempData *pIVar16;
  ulong uVar17;
  ImDrawList *draw_list;
  ImGuiTable *pIVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  float fVar23;
  undefined1 extraout_var [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  uint uVar29;
  uint uVar30;
  ImVec2 local_38;
  
  pIVar11 = GImGui;
  pIVar7 = GImGui->CurrentTable;
  if (pIVar7->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar7);
  }
  uVar29 = pIVar7->Flags;
  window = pIVar7->InnerWindow;
  pIVar8 = pIVar7->OuterWindow;
  pIVar9 = pIVar7->TempData;
  if (pIVar7->IsInsideRow == true) {
    TableEndRow(pIVar7);
  }
  if (((uVar29 & 0x20) != 0) && (pIVar7->HoveredColumnBody != -1)) {
    bVar12 = IsAnyItemHovered();
    if (!bVar12) {
      bVar12 = IsMouseReleased(1);
      if (bVar12) {
        TableOpenContextMenu((int)pIVar7->HoveredColumnBody);
      }
    }
  }
  if ((long)pIVar7->InstanceCurrent == 0) {
    pIVar14 = &pIVar7->InstanceDataFirst;
  }
  else {
    pIVar14 = (pIVar7->InstanceDataExtra).Data + (long)pIVar7->InstanceCurrent + -1;
  }
  (window->DC).PrevLineSize = pIVar9->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar9->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar9->HostBackupCursorMaxPos;
  fVar3 = pIVar7->RowPosY2;
  if (window == pIVar8) {
    if ((uVar29 >> 0x11 & 1) == 0) {
      fVar28 = (pIVar7->OuterRect).Max.y;
      uVar21 = -(uint)(fVar3 <= fVar28);
      fVar28 = (float)(~uVar21 & (uint)fVar3 | (uint)fVar28 & uVar21);
      (pIVar7->InnerRect).Max.y = fVar28;
      (pIVar7->OuterRect).Max.y = fVar28;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar3;
  }
  fVar28 = (pIVar7->OuterRect).Max.y;
  fVar26 = (pIVar7->WorkRect).Max.y;
  uVar21 = -(uint)(fVar28 <= fVar26);
  (pIVar7->WorkRect).Max.y = (float)(~uVar21 & (uint)fVar28 | (uint)fVar26 & uVar21);
  pIVar14->LastOuterHeight = fVar28 - (pIVar7->OuterRect).Min.y;
  if (((uint)pIVar7->Flags >> 0x18 & 1) != 0) {
    fVar28 = (pIVar7->InnerWindow->DC).CursorMaxPos.x;
    if ((long)pIVar7->RightMostEnabledColumn != -1) {
      fVar26 = 0.0;
      if (((uint)pIVar7->Flags >> 10 & 1) != 0) {
        fVar26 = 1.0;
      }
      fVar26 = ((pIVar7->Columns).Data[pIVar7->RightMostEnabledColumn].WorkMaxX +
                pIVar7->CellPaddingX + pIVar7->OuterPaddingX) - fVar26;
      uVar21 = -(uint)(fVar26 <= fVar28);
      fVar28 = (float)(uVar21 & (uint)fVar28 | ~uVar21 & (uint)fVar26);
    }
    if (pIVar7->ResizedColumn != -1) {
      uVar21 = -(uint)(pIVar7->ResizeLockMinContentsX2 <= fVar28);
      fVar28 = (float)((uint)fVar28 & uVar21 | ~uVar21 & (uint)pIVar7->ResizeLockMinContentsX2);
    }
    (pIVar7->InnerWindow->DC).CursorMaxPos.x = fVar28;
  }
  if ((uVar29 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  draw_list = window->DrawList;
  pIVar2 = (draw_list->_ClipRectStack).Data + (long)(draw_list->_ClipRectStack).Size + -1;
  fVar28 = pIVar2->y;
  fVar26 = pIVar2->z;
  fVar27 = pIVar2->w;
  (window->ClipRect).Min.x = pIVar2->x;
  (window->ClipRect).Min.y = fVar28;
  (window->ClipRect).Max.x = fVar26;
  (window->ClipRect).Max.y = fVar27;
  if ((uVar29 & 0x780) != 0) {
    TableDrawBorders(pIVar7);
    draw_list = window->DrawList;
  }
  this = pIVar7->DrawSplitter;
  uVar17 = 0;
  ImDrawListSplitter::SetCurrentChannel(this,draw_list,0);
  if ((pIVar7->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar7);
  }
  ImDrawListSplitter::Merge(this,window->DrawList);
  uVar19 = (ulong)(uint)pIVar7->ColumnsCount;
  if (pIVar7->ColumnsCount < 1) {
    uVar19 = uVar17;
  }
  fVar28 = 0.0;
  uVar29 = 0;
  uVar21 = 0;
  uVar30 = 0;
  fVar27 = 0.0;
  fVar26 = 0.0;
  for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
    if ((pIVar7->EnabledMaskByIndex >> (uVar20 & 0x3f) & 1) != 0) {
      pIVar10 = (pIVar7->Columns).Data;
      uVar22 = *(uint *)((long)&pIVar10->Flags + uVar17);
      if ((uVar22 & 0x30) == 0x10) {
        fVar23 = *(float *)((long)&pIVar10->WidthRequest + uVar17);
        auVar24 = (undefined1  [12])0x0;
      }
      else {
        fVar23 = TableGetColumnWidthAuto
                           (pIVar7,(ImGuiTableColumn *)((long)&pIVar10->Flags + uVar17));
        auVar24 = extraout_var;
      }
      if ((uVar22 & 0x10) == 0) {
        fVar27 = fVar27 + fVar23;
      }
      else {
        fVar26 = fVar26 + fVar23;
      }
      if ((~uVar22 & 0x28) == 0) {
        fVar23 = fVar23 / (*(float *)((long)&pIVar10->StretchWeight + uVar17) /
                          pIVar7->ColumnsStretchSumWeights);
        uVar22 = -(uint)(fVar23 <= fVar28);
        auVar25._0_4_ = uVar22 & (uint)fVar28;
        auVar25._4_4_ = auVar24._0_4_ & uVar29;
        auVar25._8_4_ = auVar24._4_4_ & uVar21;
        auVar25._12_4_ = auVar24._8_4_ & uVar30;
        auVar25 = auVar25 | ZEXT416(~uVar22 & (uint)fVar23);
        fVar28 = auVar25._0_4_;
        uVar29 = auVar25._4_4_;
        uVar21 = auVar25._8_4_;
        uVar30 = auVar25._12_4_;
      }
    }
    uVar17 = uVar17 + 0x68;
  }
  fVar23 = pIVar7->CellPaddingX + pIVar7->CellPaddingX;
  pIVar7->ColumnsAutoFitWidth =
       (float)(~-(uint)(fVar28 <= fVar27) & (uint)fVar28 | (uint)fVar27 & -(uint)(fVar28 <= fVar27))
       + fVar26 + (float)(int)pIVar7->ColumnsEnabledCount * fVar23 +
                  pIVar7->OuterPaddingX + pIVar7->OuterPaddingX +
                  (float)(pIVar7->ColumnsEnabledCount + -1) *
                  (pIVar7->CellSpacingX1 + pIVar7->CellSpacingX2);
  if ((window == pIVar8) || ((pIVar7->Flags & 0x1000000U) != 0)) {
    if (((long)pIVar7->LastResizedColumn != -1) &&
       (((pIVar7->ResizedColumn == -1 && (window->ScrollbarX == true)) &&
        (pIVar7->InstanceInteracted == pIVar7->InstanceCurrent)))) {
      fVar23 = fVar23 + pIVar7->MinColumnWidth;
      fVar28 = (pIVar7->Columns).Data[pIVar7->LastResizedColumn].MaxX;
      if ((pIVar7->InnerClipRect).Min.x <= fVar28) {
        pIVar1 = &(pIVar7->InnerClipRect).Max;
        if (fVar28 < pIVar1->x || fVar28 == pIVar1->x) goto LAB_002067fc;
        fVar23 = fVar23 + (fVar28 - (window->Pos).x);
      }
      else {
        fVar23 = (fVar28 - (window->Pos).x) - fVar23;
      }
      SetScrollFromPosX(window,fVar23,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_002067fc:
  if (((long)pIVar7->ResizedColumn != -1) && (pIVar7->InstanceCurrent == pIVar7->InstanceInteracted)
     ) {
    pIVar7->ResizedColumnNextWidth =
         (float)(int)((((((pIVar11->IO).MousePos.x - (pIVar11->ActiveIdClickOffset).x) + 4.0) -
                       (pIVar7->Columns).Data[pIVar7->ResizedColumn].MinX) - pIVar7->CellSpacingX1)
                     - (pIVar7->CellPaddingX + pIVar7->CellPaddingX));
  }
  PopID();
  fVar28 = (pIVar8->DC).CursorMaxPos.x;
  fVar26 = (pIVar8->DC).CursorMaxPos.y;
  IVar5 = (pIVar9->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar9->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar5;
  IVar5 = (pIVar9->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar9->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar5;
  window->SkipItems = pIVar7->HostSkipItems;
  (pIVar8->DC).CursorPos = (pIVar7->OuterRect).Min;
  (pIVar8->DC).ItemWidth = pIVar9->HostBackupItemWidth;
  (pIVar8->DC).ItemWidthStack.Size = pIVar9->HostBackupItemWidthStackSize;
  (pIVar8->DC).ColumnsOffset.x = (pIVar9->HostBackupColumnsOffset).x;
  if (window == pIVar8) {
    IVar5 = (pIVar7->OuterRect).Min;
    IVar6 = (pIVar7->OuterRect).Max;
    local_38.x = IVar6.x - IVar5.x;
    local_38.y = IVar6.y - IVar5.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar7->OuterRect,0,(ImRect *)0x0,0);
  }
  else {
    EndChild();
  }
  if (((uint)pIVar7->Flags >> 0x10 & 1) == 0) {
    fVar27 = (pIVar9->UserOuterSize).x;
    fVar23 = 0.0;
    if (fVar27 <= 0.0) {
      if (((uint)pIVar7->Flags >> 0x18 & 1) != 0) {
        fVar23 = (window->ScrollbarSizes).x;
      }
      fVar4 = (pIVar8->DC).IdealMaxPos.x;
      fVar27 = ((pIVar7->OuterRect).Min.x + pIVar7->ColumnsAutoFitWidth + fVar23) - fVar27;
      uVar29 = -(uint)(fVar27 <= fVar4);
      (pIVar8->DC).IdealMaxPos.x = (float)(uVar29 & (uint)fVar4 | ~uVar29 & (uint)fVar27);
      fVar27 = (pIVar7->OuterRect).Max.x;
      fVar23 = (pIVar7->OuterRect).Min.x + pIVar7->ColumnsAutoFitWidth;
      if (fVar23 <= fVar27) {
        fVar27 = fVar23;
      }
    }
    else {
      fVar27 = (pIVar7->OuterRect).Max.x;
    }
  }
  else {
    fVar27 = (pIVar7->OuterRect).Min.x + pIVar7->ColumnsAutoFitWidth;
  }
  uVar29 = -(uint)(fVar27 <= fVar28);
  (pIVar8->DC).CursorMaxPos.x = (float)(~uVar29 & (uint)fVar27 | (uint)fVar28 & uVar29);
  fVar28 = (pIVar9->UserOuterSize).y;
  fVar27 = 0.0;
  if (fVar28 <= 0.0) {
    if ((pIVar7->Flags & 0x2000000) != 0) {
      fVar27 = (window->ScrollbarSizes).y;
    }
    fVar23 = (pIVar8->DC).IdealMaxPos.y;
    fVar28 = (fVar27 + fVar3) - fVar28;
    uVar29 = -(uint)(fVar28 <= fVar23);
    (pIVar8->DC).IdealMaxPos.y = (float)(uVar29 & (uint)fVar23 | ~uVar29 & (uint)fVar28);
    fVar28 = (pIVar7->OuterRect).Max.y;
    if (fVar3 <= fVar28) {
      fVar28 = fVar3;
    }
  }
  else {
    fVar28 = (pIVar7->OuterRect).Max.y;
  }
  uVar29 = -(uint)(fVar28 <= fVar26);
  (pIVar8->DC).CursorMaxPos.y = (float)(~uVar29 & (uint)fVar28 | (uint)fVar26 & uVar29);
  if (pIVar7->IsSettingsDirty == true) {
    TableSaveSettings(pIVar7);
  }
  pIVar7->IsInitializing = false;
  lVar15 = (long)pIVar11->TablesTempDataStacked;
  pIVar11->TablesTempDataStacked = pIVar11->TablesTempDataStacked + -1;
  if (1 < lVar15) {
    pIVar9 = (pIVar11->TablesTempData).Data;
    pIVar16 = pIVar9 + lVar15 + -2;
    if (pIVar16 != (ImGuiTableTempData *)0x0) {
      pIVar7 = (pIVar11->Tables).Buf.Data;
      pIVar18 = pIVar7 + pIVar16->TableIndex;
      pIVar11->CurrentTable = pIVar18;
      iVar13 = -1;
      if (pIVar7 != (ImGuiTable *)0x0) {
        pIVar18->TempData = pIVar16;
        pIVar11->CurrentTable->DrawSplitter = &pIVar9[lVar15 + -2].DrawSplitter;
        if (pIVar11->CurrentTable != (ImGuiTable *)0x0) {
          iVar13 = (int)(((long)pIVar11->CurrentTable - (long)(pIVar11->Tables).Buf.Data) / 0x218);
        }
      }
      goto LAB_00206b1c;
    }
  }
  pIVar11->CurrentTable = (ImGuiTable *)0x0;
  iVar13 = -1;
LAB_00206b1c:
  (pIVar8->DC).CurrentTableIdx = iVar13;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table_instance->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    float auto_fit_width_for_fixed = 0.0f;
    float auto_fit_width_for_stretched = 0.0f;
    float auto_fit_width_for_stretched_min = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            float column_width_request = ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize)) ? column->WidthRequest : TableGetColumnWidthAuto(table, column);
            if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
                auto_fit_width_for_fixed += column_width_request;
            else
                auto_fit_width_for_stretched += column_width_request;
            if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) && (column->Flags & ImGuiTableColumnFlags_NoResize) != 0)
                auto_fit_width_for_stretched_min = ImMax(auto_fit_width_for_stretched_min, column_width_request / (column->StretchWeight / table->ColumnsStretchSumWeights));
        }
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount + auto_fit_width_for_fixed + ImMax(auto_fit_width_for_stretched, auto_fit_width_for_stretched_min);

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.TablesTempDataStacked > 0);
    temp_data = (--g.TablesTempDataStacked > 0) ? &g.TablesTempData[g.TablesTempDataStacked - 1] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}